

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-type.cpp
# Opt level: O1

Up __thiscall
yactfr::OptionalWithSignedIntegerSelectorType::_clone(OptionalWithSignedIntegerSelectorType *this)

{
  int in_ECX;
  void *in_RDX;
  void *__child_stack;
  long in_RSI;
  void *in_R8;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_38;
  undefined1 local_30 [32];
  
  local_30._20_4_ = *(undefined4 *)(in_RSI + 0x18);
  DataType::clone((DataType *)local_30,*(__fn **)(in_RSI + 0x20),in_RDX,in_ECX,in_R8);
  if (*(__fn **)(in_RSI + 0x10) == (__fn *)0x0) {
    local_38._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)(local_30 + 0x18),*(__fn **)(in_RSI + 0x10),__child_stack,in_ECX,in_R8
                  );
    local_38._M_head_impl = (MapItem *)local_30._24_8_;
    local_30._24_8_ = (MapItem *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               (local_30 + 0x18));
  }
  std::
  make_unique<yactfr::OptionalWithSignedIntegerSelectorType_const,unsigned_int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation_const&,yactfr::IntegerRangeSet<long_long,true>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)(local_30 + 8),
             (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
             (local_30 + 0x14),(DataLocation *)local_30,
             (IntegerRangeSet<long_long,_true> *)(in_RSI + 0x28),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (in_RSI + 0x80));
  (this->super_OptionalWithIntegerSelectorType<long_long>).super_OptionalType.super_CompoundDataType
  .super_DataType._vptr_DataType = (_func_int **)local_30._8_8_;
  local_30._8_8_ = (pointer)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_38);
  if ((_func_int **)local_30._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_30._0_8_ + 8))();
  }
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up OptionalWithSignedIntegerSelectorType::_clone() const
{
    return OptionalWithSignedIntegerSelectorType::create(this->minimumAlignment(),
                                                         this->dataType().clone(),
                                                         this->selectorLocation(),
                                                         this->selectorRanges(),
                                                         internal::tryCloneAttrs(this->attributes()));
}